

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O2

void __thiscall QUndoStack::~QUndoStack(QUndoStack *this)

{
  ~QUndoStack(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

QUndoStack::~QUndoStack()
{
#if QT_CONFIG(undogroup)
    Q_D(QUndoStack);
    if (d->group != nullptr)
        d->group->removeStack(this);
#endif
    clear();
}